

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O1

void anon_unknown.dwarf_2299d::fillChannels(Rand48 *random,DeepImageLevel *level)

{
  DeepImageChannel *pDVar1;
  ImageLevel *pIVar2;
  _func_int **pp_Var3;
  bool bVar4;
  short sVar5;
  uint *puVar6;
  long lVar7;
  iterator iVar8;
  Iterator IVar9;
  ostream *poVar10;
  ImageChannel *pIVar11;
  DeepImageLevel *pDVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  double dVar17;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"             sample counts ",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  iVar13 = (level->_sampleCounts).super_ImageChannel._pixelsPerColumn *
           (level->_sampleCounts).super_ImageChannel._pixelsPerRow;
  puVar6 = Imf_2_5::SampleCountChannel::beginEdit(&level->_sampleCounts);
  if (iVar13 != 0) {
    lVar14 = 0;
    do {
      lVar7 = Imath_2_5::nrand48(random->_state);
      puVar6[lVar14] =
           (int)lVar7 +
           ((int)(SUB168(SEXT816(lVar7) * SEXT816(0x6666666666666667),8) >> 2) -
           (SUB164(SEXT816(lVar7) * SEXT816(0x6666666666666667),0xc) >> 0x1f)) * -10;
      lVar14 = lVar14 + 1;
    } while (iVar13 != lVar14);
  }
  Imf_2_5::SampleCountChannel::endEdit(&level->_sampleCounts);
  iVar8._M_node = (_Base_ptr)Imf_2_5::DeepImageLevel::begin(level);
  do {
    IVar9 = Imf_2_5::DeepImageLevel::end(level);
    if ((iterator)iVar8._M_node == IVar9._i._M_node) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"             channel ",0x15);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,*(char **)(iVar8._M_node + 1),
                         (long)iVar8._M_node[1]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar13 = (**(code **)**(undefined8 **)(iVar8._M_node + 2))();
    if (iVar13 == 0) {
      pDVar1 = *(DeepImageChannel **)(iVar8._M_node + 2);
      pIVar11 = (ImageChannel *)
                __dynamic_cast(pDVar1,&Imf_2_5::DeepImageChannel::typeinfo,
                               &Imf_2_5::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
      if (pIVar11 == (ImageChannel *)0x0) goto LAB_00115181;
      pIVar2 = pIVar11->_level;
      pDVar12 = Imf_2_5::DeepImageChannel::deepLevel(pDVar1);
      iVar13 = (pIVar2->_dataWindow).min.y;
      if (iVar13 <= (pIVar2->_dataWindow).max.y) {
        do {
          iVar15 = (pIVar2->_dataWindow).min.x;
          if (iVar15 <= (pIVar2->_dataWindow).max.x) {
            do {
              Imf_2_5::ImageChannel::boundsCheck
                        (&(pDVar12->_sampleCounts).super_ImageChannel,iVar15,iVar13);
              lVar14 = (long)(int)(pDVar12->_sampleCounts)._base
                                  [(pDVar12->_sampleCounts).super_ImageChannel._pixelsPerRow *
                                   iVar13 + iVar15];
              Imf_2_5::ImageChannel::boundsCheck(pIVar11,iVar15,iVar13);
              if (0 < lVar14) {
                pp_Var3 = (&(pIVar11[1]._level)->_vptr_ImageLevel)
                          [pIVar11->_pixelsPerRow * iVar13 + iVar15];
                lVar7 = 0;
                do {
                  dVar17 = (double)Imath_2_5::erand48(random->_state);
                  *(int *)((long)pp_Var3 + lVar7 * 4) =
                       (int)(long)((1.0 - dVar17) * 0.0 + dVar17 * 100.0);
                  lVar7 = lVar7 + 1;
                } while (lVar14 != lVar7);
              }
              bVar4 = iVar15 < (pIVar2->_dataWindow).max.x;
              iVar15 = iVar15 + 1;
            } while (bVar4);
          }
          bVar4 = iVar13 < (pIVar2->_dataWindow).max.y;
          iVar13 = iVar13 + 1;
        } while (bVar4);
      }
    }
    else if (iVar13 == 2) {
      pDVar1 = *(DeepImageChannel **)(iVar8._M_node + 2);
      pIVar11 = (ImageChannel *)
                __dynamic_cast(pDVar1,&Imf_2_5::DeepImageChannel::typeinfo,
                               &Imf_2_5::TypedDeepImageChannel<float>::typeinfo,0);
      if (pIVar11 == (ImageChannel *)0x0) goto LAB_00115181;
      pIVar2 = pIVar11->_level;
      pDVar12 = Imf_2_5::DeepImageChannel::deepLevel(pDVar1);
      iVar13 = (pIVar2->_dataWindow).min.y;
      if (iVar13 <= (pIVar2->_dataWindow).max.y) {
        do {
          iVar15 = (pIVar2->_dataWindow).min.x;
          if (iVar15 <= (pIVar2->_dataWindow).max.x) {
            do {
              Imf_2_5::ImageChannel::boundsCheck
                        (&(pDVar12->_sampleCounts).super_ImageChannel,iVar15,iVar13);
              lVar14 = (long)(int)(pDVar12->_sampleCounts)._base
                                  [(pDVar12->_sampleCounts).super_ImageChannel._pixelsPerRow *
                                   iVar13 + iVar15];
              Imf_2_5::ImageChannel::boundsCheck(pIVar11,iVar15,iVar13);
              if (0 < lVar14) {
                pp_Var3 = (&(pIVar11[1]._level)->_vptr_ImageLevel)
                          [pIVar11->_pixelsPerRow * iVar13 + iVar15];
                lVar7 = 0;
                do {
                  dVar17 = (double)Imath_2_5::erand48(random->_state);
                  *(float *)((long)pp_Var3 + lVar7 * 4) =
                       (float)((1.0 - dVar17) * 0.0 + dVar17 * 100.0);
                  lVar7 = lVar7 + 1;
                } while (lVar14 != lVar7);
              }
              bVar4 = iVar15 < (pIVar2->_dataWindow).max.x;
              iVar15 = iVar15 + 1;
            } while (bVar4);
          }
          bVar4 = iVar13 < (pIVar2->_dataWindow).max.y;
          iVar13 = iVar13 + 1;
        } while (bVar4);
      }
    }
    else {
      if (iVar13 != 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                      ,0x129,"void (anonymous namespace)::fillChannels(Rand48 &, DeepImageLevel &)")
        ;
      }
      pDVar1 = *(DeepImageChannel **)(iVar8._M_node + 2);
      pIVar11 = (ImageChannel *)
                __dynamic_cast(pDVar1,&Imf_2_5::DeepImageChannel::typeinfo,
                               &Imf_2_5::TypedDeepImageChannel<half>::typeinfo,0);
      if (pIVar11 == (ImageChannel *)0x0) {
LAB_00115181:
        __cxa_bad_cast();
      }
      pIVar2 = pIVar11->_level;
      pDVar12 = Imf_2_5::DeepImageChannel::deepLevel(pDVar1);
      iVar13 = (pIVar2->_dataWindow).min.y;
      if (iVar13 <= (pIVar2->_dataWindow).max.y) {
        do {
          iVar15 = (pIVar2->_dataWindow).min.x;
          if (iVar15 <= (pIVar2->_dataWindow).max.x) {
            do {
              Imf_2_5::ImageChannel::boundsCheck
                        (&(pDVar12->_sampleCounts).super_ImageChannel,iVar15,iVar13);
              lVar14 = (long)(int)(pDVar12->_sampleCounts)._base
                                  [(pDVar12->_sampleCounts).super_ImageChannel._pixelsPerRow *
                                   iVar13 + iVar15];
              Imf_2_5::ImageChannel::boundsCheck(pIVar11,iVar15,iVar13);
              if (0 < lVar14) {
                pp_Var3 = (&(pIVar11[1]._level)->_vptr_ImageLevel)
                          [pIVar11->_pixelsPerRow * iVar13 + iVar15];
                lVar7 = 0;
                do {
                  dVar17 = (double)Imath_2_5::erand48(random->_state);
                  fVar16 = (float)((1.0 - dVar17) * 0.0 + dVar17 * 100.0);
                  if ((fVar16 != 0.0) || (NAN(fVar16))) {
                    sVar5 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar16 >> 0x17) * 2);
                    if (sVar5 == 0) {
                      sVar5 = half::convert((int)fVar16);
                    }
                    else {
                      sVar5 = sVar5 + (short)(((uint)fVar16 & 0x7fffff) + 0xfff +
                                              (uint)(((uint)fVar16 >> 0xd & 1) != 0) >> 0xd);
                    }
                  }
                  else {
                    sVar5 = (short)((uint)fVar16 >> 0x10);
                  }
                  *(short *)((long)pp_Var3 + lVar7 * 2) = sVar5;
                  lVar7 = lVar7 + 1;
                } while (lVar14 != lVar7);
              }
              bVar4 = iVar15 < (pIVar2->_dataWindow).max.x;
              iVar15 = iVar15 + 1;
            } while (bVar4);
          }
          bVar4 = iVar13 < (pIVar2->_dataWindow).max.y;
          iVar13 = iVar13 + 1;
        } while (bVar4);
      }
    }
    iVar8._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar8._M_node);
  } while( true );
}

Assistant:

void
fillChannels (Rand48 &random, DeepImageLevel &level)
{
    cout << "             sample counts " << endl;
    fillSampleCounts (random, level.sampleCounts());

    for (DeepImageLevel::Iterator i = level.begin(); i != level.end(); ++i)
    {
        cout << "             channel " << i.name() << endl;

        switch (i.channel().pixelType())
        {
          case HALF:
            fillChannel <half> (random, i.channel());
            break;

          case FLOAT:
            fillChannel <float> (random, i.channel());
            break;

          case UINT:
            fillChannel <unsigned int> (random, i.channel());
            break;

          default:
             assert (false);
        }
    }
}